

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_safecopy(BYTE *op,BYTE *oend_w,BYTE *ip,ptrdiff_t length,ZSTD_overlap_e ovtype)

{
  BYTE *pBVar1;
  BYTE BVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  BYTE *pBVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = (long)op - (long)ip;
  pBVar1 = op + length;
  if (ovtype == ZSTD_no_overlap) {
    if (op < oend_w && uVar7 + 7 < 0xf) goto LAB_0017b7d8;
    if (length < 8) goto LAB_0017b625;
  }
  else {
    if ((ovtype != ZSTD_overlap_src_before_dst) || ((long)uVar7 < 0)) {
LAB_0017b7d8:
      __assert_fail("(ovtype == ZSTD_no_overlap && (diff <= -8 || diff >= 8 || op >= oend_w)) || (ovtype == ZSTD_overlap_src_before_dst && diff >= 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x6326,
                    "void ZSTD_safecopy(BYTE *, BYTE *const, const BYTE *, ptrdiff_t, ZSTD_overlap_e)"
                   );
    }
    if (length < 8) {
LAB_0017b625:
      if (length < 1) {
        return;
      }
      do {
        BVar2 = *ip;
        ip = ip + 1;
        *op = BVar2;
        op = op + 1;
      } while (op < pBVar1);
      return;
    }
    if (op < ip) {
      __assert_fail("*ip <= *op",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x6301,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
    }
    if (uVar7 < 8) {
      iVar3 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)::
                       dec64table + uVar7 * 4);
      *op = *ip;
      op[1] = ip[1];
      op[2] = ip[2];
      op[3] = ip[3];
      pBVar6 = ip + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                              ::dec32table + uVar7 * 4);
      ip = ip + ((ulong)*(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                  ::dec32table + uVar7 * 4) - (long)iVar3);
      *(undefined4 *)(op + 4) = *(undefined4 *)pBVar6;
    }
    else {
      *(undefined8 *)op = *(undefined8 *)ip;
    }
    ip = ip + 8;
    op = op + 8;
    if ((long)op - (long)ip < 8) {
      __assert_fail("*op - *ip >= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x6313,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
    }
  }
  if (oend_w < pBVar1) {
    if (op <= oend_w) {
      lVar8 = (long)op - (long)ip;
      if ((lVar8 < 8) && (ovtype != ZSTD_no_overlap || -0x10 < lVar8)) goto LAB_0017b7f7;
      lVar5 = (long)oend_w - (long)op;
      pBVar6 = ip;
      if (lVar8 < 0x10 && ovtype != ZSTD_no_overlap) {
        do {
          *(undefined8 *)op = *(undefined8 *)pBVar6;
          op = op + 8;
          pBVar6 = pBVar6 + 8;
        } while (op < oend_w);
      }
      else {
        if (0xffffffffffffffe0 < lVar8 - 0x10U) goto LAB_0017b854;
        uVar4 = *(undefined8 *)(ip + 8);
        *(undefined8 *)op = *(undefined8 *)ip;
        *(undefined8 *)(op + 8) = uVar4;
        if (0x10 < lVar5) {
          lVar8 = 0x10;
          do {
            uVar4 = *(undefined8 *)(ip + lVar8 + 8);
            pBVar6 = op + lVar8;
            *(undefined8 *)pBVar6 = *(undefined8 *)(ip + lVar8);
            *(undefined8 *)(pBVar6 + 8) = uVar4;
            uVar4 = *(undefined8 *)(ip + lVar8 + 0x10 + 8);
            *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)(ip + lVar8 + 0x10);
            *(undefined8 *)(pBVar6 + 0x18) = uVar4;
            lVar8 = lVar8 + 0x20;
          } while (pBVar6 + 0x20 < oend_w);
        }
      }
      ip = ip + lVar5;
      op = oend_w;
    }
    for (; op < pBVar1; op = op + 1) {
      BVar2 = *ip;
      ip = ip + 1;
      *op = BVar2;
    }
  }
  else {
    lVar8 = (long)op - (long)ip;
    if ((lVar8 < 8) && (ovtype != ZSTD_no_overlap || -0x10 < lVar8)) {
LAB_0017b7f7:
      __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1268,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    pBVar1 = op + length;
    if (lVar8 < 0x10 && ovtype != ZSTD_no_overlap) {
      do {
        *(undefined8 *)op = *(undefined8 *)ip;
        op = op + 8;
        ip = ip + 8;
      } while (op < pBVar1);
    }
    else {
      if (0xffffffffffffffe0 < lVar8 - 0x10U) {
LAB_0017b854:
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1270,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      uVar4 = *(undefined8 *)(ip + 8);
      *(undefined8 *)op = *(undefined8 *)ip;
      *(undefined8 *)(op + 8) = uVar4;
      if (0x10 < (ulong)length) {
        lVar8 = 0x10;
        do {
          uVar4 = *(undefined8 *)(ip + lVar8 + 8);
          pBVar6 = op + lVar8;
          *(undefined8 *)pBVar6 = *(undefined8 *)(ip + lVar8);
          *(undefined8 *)(pBVar6 + 8) = uVar4;
          uVar4 = *(undefined8 *)(ip + lVar8 + 0x10 + 8);
          *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)(ip + lVar8 + 0x10);
          *(undefined8 *)(pBVar6 + 0x18) = uVar4;
          lVar8 = lVar8 + 0x20;
        } while (pBVar6 + 0x20 < pBVar1);
      }
    }
  }
  return;
}

Assistant:

static void ZSTD_safecopy(BYTE* op, BYTE* const oend_w, BYTE const* ip, ptrdiff_t length, ZSTD_overlap_e ovtype) {
    ptrdiff_t const diff = op - ip;
    BYTE* const oend = op + length;

    assert((ovtype == ZSTD_no_overlap && (diff <= -8 || diff >= 8 || op >= oend_w)) ||
           (ovtype == ZSTD_overlap_src_before_dst && diff >= 0));

    if (length < 8) {
        /* Handle short lengths. */
        while (op < oend) *op++ = *ip++;
        return;
    }
    if (ovtype == ZSTD_overlap_src_before_dst) {
        /* Copy 8 bytes and ensure the offset >= 8 when there can be overlap. */
        assert(length >= 8);
        ZSTD_overlapCopy8(&op, &ip, diff);
        assert(op - ip >= 8);
        assert(op <= oend);
    }

    if (oend <= oend_w) {
        /* No risk of overwrite. */
        ZSTD_wildcopy(op, ip, length, ovtype);
        return;
    }
    if (op <= oend_w) {
        /* Wildcopy until we get close to the end. */
        assert(oend > oend_w);
        ZSTD_wildcopy(op, ip, oend_w - op, ovtype);
        ip += oend_w - op;
        op = oend_w;
    }
    /* Handle the leftovers. */
    while (op < oend) *op++ = *ip++;
}